

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O3

FileHandle __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file
          (file_pool_impl<libtorrent::aux::file_view_entry> *this,storage_index_t st,string *p,
          file_index_t file_index,file_storage *fs,open_mode_t m)

{
  sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
  *psVar1;
  header_holder_type *phVar2;
  condition_variable *this_00;
  pointer psVar3;
  unsigned_long uVar4;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
  *poVar5;
  file_id file_key_00;
  undefined1 auVar6 [16];
  iterator x;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
  *poVar7;
  final_node_type *x_00;
  final_node_type *pfVar8;
  undefined4 in_register_0000000c;
  uint uVar9;
  ulong extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  undefined4 in_register_00000034;
  file_pool_impl<libtorrent::aux::file_view_entry> *this_01;
  undefined4 in_register_0000008c;
  node_ptr plVar12;
  file_pool_impl<libtorrent::aux::file_view_entry> *pfVar13;
  int iVar15;
  undefined1 auVar14 [16];
  pair<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_bool>
  pVar16;
  FileHandle FVar17;
  open_mode_t in_stack_00000008;
  unique_lock<std::mutex> l;
  file_id file_key;
  FileHandle defer_destruction2;
  wait_open_entry woe;
  file_view_entry e;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  unique_lock<std::mutex> local_168;
  file_pool_impl<libtorrent::aux::file_view_entry> *local_158;
  pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  local_150;
  FileHandle local_148 [3];
  __shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2> local_118;
  undefined1 local_108 [16];
  file_id local_f8;
  undefined1 local_e8 [8];
  undefined1 auStack_e0 [8];
  node_ptr local_d8;
  undefined1 local_c8 [24];
  system_error_category *local_b0;
  undefined4 local_a8;
  file_view_entry local_70;
  storage_error local_48;
  ulong uVar10;
  
  this_01 = (file_pool_impl<libtorrent::aux::file_view_entry> *)
            CONCAT44(in_register_00000034,st.m_val);
  local_118._M_ptr = (element_type *)0x0;
  local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_168._M_device = &this_01->m_mutex;
  local_168._M_owns = false;
  local_158 = this;
  ::std::unique_lock<std::mutex>::lock(&local_168);
  local_168._M_owns = true;
  local_150.first.m_val = (uint)p;
  local_150.second.m_val = (int)fs;
  x = boost::multi_index::detail::
      ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
      ::
      find<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>
                ((ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                  *)&(this_01->m_files).super_type,&local_150);
  poVar7 = (this_01->m_files).
           super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           .member;
  if (x.node == poVar7) {
    phVar2 = &(this_01->m_opening_files).super_type.data_.root_plus_size_.m_header;
    plVar12 = (this_01->m_opening_files).super_type.data_.root_plus_size_.m_header.super_node.next_;
    uVar10 = extraout_RDX;
    if (plVar12 != &phVar2->super_node) {
      do {
        auVar14._0_4_ = -(uint)((uint)plVar12[1].next_ == local_150.first.m_val);
        iVar15 = -(uint)((int)((ulong)plVar12[1].next_ >> 0x20) == local_150.second.m_val);
        auVar14._4_4_ = auVar14._0_4_;
        auVar14._8_4_ = iVar15;
        auVar14._12_4_ = iVar15;
        uVar9 = movmskpd((int)uVar10,auVar14);
        uVar10 = (ulong)uVar9;
        if ((uVar9 == 3) &&
           (((in_stack_00000008.m_val & 1) == 0 || (((ulong)plVar12[1].prev_ & 1) != 0)))) break;
        plVar12 = plVar12->next_;
      } while (plVar12 != &phVar2->super_node);
      if (plVar12 != &phVar2->super_node) {
        this_00 = (condition_variable *)(local_108 + 0x10);
        local_108._0_8_ = (node_ptr)0x0;
        local_108._8_8_ = (node_ptr)0x0;
        ::std::condition_variable::condition_variable(this_00);
        local_c8._0_8_ = (element_type *)0x0;
        local_c8._8_5_ = 0;
        local_c8._13_3_ = 0;
        local_c8._16_4_ = 0;
        local_c8[0x14] = false;
        local_b0 = &boost::system::detail::cat_holder<void>::system_category_instance;
        local_a8 = 0xffffff;
        boost::intrusive::
        list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry::list_hook>,_unsigned_long,_true,_void>
        ::push_back((list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry::list_hook>,_unsigned_long,_true,_void>
                     *)(plVar12 + 2),(reference)local_108);
        do {
          ::std::condition_variable::wait((unique_lock *)this_00);
          pfVar13 = local_158;
          if ((element_type *)local_c8._0_8_ != (element_type *)0x0) break;
        } while (local_c8._16_4_ == 0);
        if (local_c8._16_4_ != 0) {
          throw_ex<libtorrent::storage_error,libtorrent::storage_error&>
                    ((storage_error *)(local_c8 + 0x10));
        }
        *(undefined8 *)local_158 = local_c8._0_8_;
        uVar4 = CONCAT35(local_c8._13_3_,local_c8._8_5_);
        (local_158->m_opening_files).super_type.data_.root_plus_size_.super_size_traits.size_ =
             uVar4;
        if (uVar4 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(uVar4 + 8) = *(int *)(uVar4 + 8) + 1;
            UNLOCK();
            if (CONCAT35(local_c8._13_3_,local_c8._8_5_) == 0) goto LAB_001be58d;
          }
          else {
            *(int *)(uVar4 + 8) = *(int *)(uVar4 + 8) + 1;
          }
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT35(local_c8._13_3_,local_c8._8_5_));
        }
LAB_001be58d:
        ::std::condition_variable::~condition_variable(this_00);
        if ((reference)local_108._0_8_ != (reference)local_108 &&
            (reference)local_108._0_8_ != (reference)0x0) goto LAB_001be5ea;
        goto LAB_001be5ad;
      }
      if (x.node != poVar7) goto LAB_001be15f;
    }
  }
  else {
LAB_001be15f:
    if (((in_stack_00000008.m_val & 1) == 0) ||
       ((((x.node)->
         super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
         ).
         super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
         .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_.buf[0x20] & 1U) != 0)
       ) {
      boost::multi_index::
      multi_index_container<libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>
      ::
      modify_<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::file_storage_const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>)::_lambda(libtorrent::aux::file_view_entry&)_1_>
                ((multi_index_container<libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>
                  *)&this_01->m_files,(anon_class_1_0_00000001 *)local_108,x.node);
      psVar3 = (((this_01->m_files).
                 super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                .member)->
               super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
               ).
               super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
               .super_sequenced_index_node_impl<std::allocator<char>_>.next_;
      poVar7 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
                *)&psVar3[-3].next_;
      if (psVar3 == (pointer)0x0) {
        poVar7 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
                  *)0x0;
      }
      if (x.node != poVar7) {
        psVar1 = &(poVar7->
                  super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                  ).
                  super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
        ;
        psVar3 = (poVar7->
                 super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                 ).
                 super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                 .super_sequenced_index_node_impl<std::allocator<char>_>.next_;
        ((poVar7->
         super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
         ).
         super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
         .super_sequenced_index_node_impl<std::allocator<char>_>.prior_)->next_ = psVar3;
        psVar3->prior_ =
             (poVar7->
             super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
             ).
             super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
             .super_sequenced_index_node_impl<std::allocator<char>_>.prior_;
        (poVar7->
        super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
        ).
        super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
        .super_sequenced_index_node_impl<std::allocator<char>_>.prior_ =
             ((x.node)->
             super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
             ).
             super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
             .super_sequenced_index_node_impl<std::allocator<char>_>.prior_;
        (poVar7->
        super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
        ).
        super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
        .super_sequenced_index_node_impl<std::allocator<char>_>.next_ =
             &((x.node)->
              super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
              ).
              super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
              .super_sequenced_index_node_impl<std::allocator<char>_>;
        ((x.node)->
        super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
        ).
        super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
        .super_sequenced_index_node_impl<std::allocator<char>_>.prior_ =
             &psVar1->super_sequenced_index_node_impl<std::allocator<char>_>;
        ((poVar7->
         super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
         ).
         super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
         .super_sequenced_index_node_impl<std::allocator<char>_>.prior_)->next_ =
             &psVar1->super_sequenced_index_node_impl<std::allocator<char>_>;
      }
      *(undefined8 *)local_158 =
           *(undefined8 *)
            ((long)&((x.node)->
                    super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                    ).
                    super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                    .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 8);
      uVar4 = *(unsigned_long *)
               ((long)&((x.node)->
                       super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                       ).
                       super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                       .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 0x10)
      ;
      (local_158->m_opening_files).super_type.data_.root_plus_size_.super_size_traits.size_ = uVar4;
      pfVar13 = local_158;
      if (uVar4 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(uVar4 + 8) = *(int *)(uVar4 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(uVar4 + 8) = *(int *)(uVar4 + 8) + 1;
        }
      }
LAB_001be5ad:
      local_170 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_001be5af;
    }
  }
  if ((int)(this_01->m_files).node_count < this_01->m_size + -1) {
    local_170 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    remove_oldest((file_pool_impl<libtorrent::aux::file_view_entry> *)local_108,
                  (unique_lock<std::mutex> *)this_01);
    local_170 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
  }
  poVar7 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
            *)(local_e8 + 8);
  local_108._0_8_ = (node_ptr)0x0;
  local_108._8_8_ = (node_ptr)0x0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = poVar7;
  _local_e8 = auVar6 << 0x40;
  local_f8.second.m_val = local_150.second.m_val;
  local_f8.first.m_val = local_150.first.m_val;
  local_d8 = (node_ptr)poVar7;
  boost::intrusive::
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_unsigned_long,_true,_void>
  ::push_back(&(this_01->m_opening_files).super_type,(reference)local_108);
  ::std::unique_lock<std::mutex>::unlock(&local_168);
  file_key_00.second.m_val = local_150.second.m_val;
  file_key_00.first.m_val = local_150.first.m_val;
  open_file_impl(&local_70,this_01,(string *)CONCAT44(in_register_0000000c,file_index.m_val),
                 (file_index_t)(int)fs,(file_storage *)CONCAT44(in_register_0000008c,m.m_val),
                 in_stack_00000008,file_key_00);
  ::std::unique_lock<std::mutex>::lock(&local_168);
  pVar16 = boost::multi_index::
           multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>
           ::insert_<boost::multi_index::detail::lvalue_tag>(&this_01->m_files,&local_70);
  x_00 = pVar16.first;
  if (pVar16.second == false) {
    if (((in_stack_00000008.m_val & 1) != 0) &&
       (((x_00->
         super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
         ).
         super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
         .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_.buf[0x20] & 1U) == 0)
       ) {
      local_48.ec._0_8_ = &local_118;
      local_48.ec.cat_ = (error_category *)&local_70;
      boost::multi_index::
      multi_index_container<libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>
      ::
      modify_<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::file_storage_const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>)::_lambda(libtorrent::aux::file_view_entry&)_2_>
                ((multi_index_container<libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>
                  *)&this_01->m_files,(anon_class_16_2_6e076f23 *)&local_48,x_00);
    }
    psVar3 = (((this_01->m_files).
               super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>_>
              .member)->
             super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
             ).
             super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
             .super_sequenced_index_node_impl<std::allocator<char>_>.next_;
    pfVar8 = (final_node_type *)&psVar3[-3].next_;
    if (psVar3 == (pointer)0x0) {
      pfVar8 = (final_node_type *)0x0;
    }
    if (x_00 != pfVar8) {
      psVar1 = &(pfVar8->
                super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                ).
                super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      ;
      psVar3 = (pfVar8->
               super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
               ).
               super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
               .super_sequenced_index_node_impl<std::allocator<char>_>.next_;
      ((pfVar8->
       super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
       ).
       super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
       .super_sequenced_index_node_impl<std::allocator<char>_>.prior_)->next_ = psVar3;
      psVar3->prior_ =
           (pfVar8->
           super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           ).
           super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           .super_sequenced_index_node_impl<std::allocator<char>_>.prior_;
      (pfVar8->
      super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      ).
      super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      .super_sequenced_index_node_impl<std::allocator<char>_>.prior_ =
           (x_00->
           super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           ).
           super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           .super_sequenced_index_node_impl<std::allocator<char>_>.prior_;
      (pfVar8->
      super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      ).
      super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      .super_sequenced_index_node_impl<std::allocator<char>_>.next_ =
           &(x_00->
            super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
            ).
            super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
            .super_sequenced_index_node_impl<std::allocator<char>_>;
      (x_00->
      super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      ).
      super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      .super_sequenced_index_node_impl<std::allocator<char>_>.prior_ =
           &psVar1->super_sequenced_index_node_impl<std::allocator<char>_>;
      ((pfVar8->
       super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
       ).
       super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
       .super_sequenced_index_node_impl<std::allocator<char>_>.prior_)->next_ =
           &psVar1->super_sequenced_index_node_impl<std::allocator<char>_>;
    }
  }
  pfVar13 = local_158;
  local_148[0].super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = *(element_type **)
          ((long)&(x_00->
                  super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                  ).
                  super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                  .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 8);
  local_148[0].super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        ((long)&(x_00->
                super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                ).
                super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 0x10);
  if (local_148[0].super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_148[0].super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_148[0].
            super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_148[0].super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_148[0].
            super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48.ec._0_8_ = (ulong)(uint3)local_48.ec._5_3_ << 0x28;
  local_48.ec.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_48._16_3_ = 0xffffff;
  local_48.operation = unknown;
  notify_file_open(this_01,(opening_file_entry *)local_108,local_148,&local_48);
  if (local_148[0].super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148[0].
               super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  *(undefined8 *)pfVar13 =
       *(undefined8 *)
        ((long)&(x_00->
                super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                ).
                super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 8);
  uVar4 = *(unsigned_long *)
           ((long)&(x_00->
                   super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                   ).
                   super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                   .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 0x10);
  (pfVar13->m_opening_files).super_type.data_.root_plus_size_.super_size_traits.size_ = uVar4;
  if (uVar4 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(uVar4 + 8) = *(int *)(uVar4 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(uVar4 + 8) = *(int *)(uVar4 + 8) + 1;
    }
  }
  if (local_70.mapping.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.mapping.
               super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  while (auStack_e0 != (undefined1  [8])poVar7) {
    poVar5 = *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
               **)&(((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
                      *)auStack_e0)->
                   super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                   ).
                   super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                   .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_;
    *(undefined1 (*) [16])
     &(((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
         *)auStack_e0)->
      super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      ).
      super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
      .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ = (undefined1  [16])0x0;
    auStack_e0 = (undefined1  [8])poVar5;
  }
  _local_e8 = (undefined1  [16])0x0;
  local_d8 = (node_ptr)0x0;
  if ((opening_file_entry *)local_108._0_8_ != (opening_file_entry *)local_108 &&
      (opening_file_entry *)local_108._0_8_ != (opening_file_entry *)0x0) {
LAB_001be5ea:
    __assert_fail("!hook.is_linked()","/usr/include/boost/intrusive/detail/generic_hook.hpp",0x30,
                  "void boost::intrusive::detail::destructor_impl(Hook &, detail::link_dispatch<safe_link>) [Hook = boost::intrusive::generic_hook<boost::intrusive::CircularListAlgorithms, boost::intrusive::list_node_traits<void *>, boost::intrusive::member_tag, boost::intrusive::safe_link, boost::intrusive::NoBaseHookId>]"
                 );
  }
LAB_001be5af:
  ::std::unique_lock<std::mutex>::~unique_lock(&local_168);
  _Var11._M_pi = extraout_RDX_00;
  if (local_118._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_refcount._M_pi);
    _Var11._M_pi = extraout_RDX_01;
  }
  if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
    _Var11._M_pi = extraout_RDX_02;
  }
  FVar17.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var11._M_pi;
  FVar17.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pfVar13;
  return (FileHandle)
         FVar17.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename file_pool_impl<FileEntry>::FileHandle
	file_pool_impl<FileEntry>::open_file(storage_index_t st, std::string const& p
		, file_index_t const file_index, file_storage const& fs
		, open_mode_t const m
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
		, std::shared_ptr<std::mutex> open_unmap_lock
#endif
		)
	{
		// potentially used to hold a reference to a file object that's
		// about to be destructed. If we have such object we assign it to
		// this member to be destructed after we release the std::mutex. On some
		// operating systems (such as OSX) closing a file may take a long
		// time. We don't want to hold the std::mutex for that.
		FileHandle defer_destruction1;
		FileHandle defer_destruction2;

		std::unique_lock<std::mutex> l(m_mutex);

		TORRENT_ASSERT(is_complete(p));
		auto& key_view = m_files.template get<0>();
		file_id const file_key{st, file_index};
		auto i = key_view.find(file_key);

		if (i == key_view.end())
		{
			auto opening = std::find_if(m_opening_files.begin(), m_opening_files.end()
				, [&file_key, m](opening_file_entry const& oe) {
					return oe.file_key == file_key
						&& (!(m & open_mode::write) || (oe.mode & open_mode::write));
				});
			if (opening != m_opening_files.end())
			{
				wait_open_entry woe;
				opening->waiters.push_back(woe);

#if TRACE_FILE_POOL
				std::cout << std::this_thread::get_id() << " waiting for: ("
					<< file_key.first << ", " << file_key.second << ")\n";
#endif
				do {
					woe.cond.wait(l);
				} while (!woe.mapping && !woe.error);
				if (woe.error)
				{
#if TRACE_FILE_POOL
					std::cout << std::this_thread::get_id() << " open failed: ("
						<< file_key.first << ", " << file_key.second
						<< "): " << woe.error.ec << std::endl;
#endif
					throw_ex<storage_error>(woe.error);
				}

#if TRACE_FILE_POOL
				std::cout << std::this_thread::get_id() << " file opened: ("
					<< file_key.first << ", " << file_key.second << ")\n";
#endif
				return woe.mapping;
			}
		}

		// make sure the write bit is set if we asked for it
		// it's OK to use a read-write file if we just asked for read. But if
		// we asked for write, the file we serve back must be opened in write
		// mode
		if (i != key_view.end()
			&& (!(m & open_mode::write) || (i->mode & open_mode::write)))
		{
			key_view.modify(i, [&](FileEntry& e)
			{
				e.last_use = aux::time_now();
			});

			auto& lru_view = m_files. template get<1>();
			lru_view.relocate(m_files. template project<1>(i), lru_view.begin());

			return i->mapping;
		}

		if (int(m_files.size()) >= m_size - 1)
		{
			// the file cache is at its maximum size, close
			// the least recently used file
			defer_destruction1 = remove_oldest(l);
		}

		opening_file_entry ofe;
		ofe.file_key = file_key;
		ofe.mode = m;
		m_opening_files.push_back(ofe);

#if TRACE_FILE_POOL
		std::cout << std::this_thread::get_id() << " opening file: ("
			<< file_key.first << ", " << file_key.second << ")\n";
#endif

		l.unlock();

		try
		{
			FileEntry e = open_file_impl(p, file_index, fs, m, file_key
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
				, open_unmap_lock
#endif
				);

			l.lock();

			// there's an edge case where two threads are racing to insert a newly
			// opened file, one thread is opening a file for writing and the other
			// fore reading. If the reading thread wins, it's important that the
			// thread opening for writing still overwrites the file in the pool,
			// since a file opened for reading and writing can be used for both.
			// So, we can't move e in here, because we may need it again of the
			// insertion failed.
			// if the insertion failed, check to see if we can use the existing
			// entry. If not, overwrite it with the newly opened file ``e``.
			bool added;
			std::tie(i, added) = key_view.insert(e);
			if (added == false)
			{
				// this is the case where this file was already in the pool. Make
				// sure we can use it. If we asked for write mode, it must have been
				// opened in write mode too.
				TORRENT_ASSERT(i != key_view.end());

				if ((m & open_mode::write) && !(i->mode & open_mode::write))
				{
					key_view.modify(i, [&](FileEntry& fe)
					{
						defer_destruction2 = std::move(fe.mapping);
						fe = std::move(e);
					});
				}

				auto& lru_view = m_files.template get<1>();
				lru_view.relocate(m_files. template project<1>(i), lru_view.begin());
			}
			notify_file_open(ofe, i->mapping, storage_error());
			return i->mapping;
		}
		catch (storage_error const& se)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, se);
			throw;
		}
		catch (std::bad_alloc const&)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, storage_error(
				errors::no_memory, file_index, operation_t::file_open));
			throw;
		}
		catch (boost::system::system_error const& se)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, storage_error(
				se.code(), file_index, operation_t::file_open));
			throw;
		}
		catch (...)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, storage_error(
				errors::no_memory, file_index, operation_t::file_open));
			throw;
		}
	}